

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
math::wide_integer::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *out,
          uintwide_t<256U,_unsigned_short,_void,_false> *x)

{
  uint uVar1;
  unsigned_fast_type uVar2;
  uint_fast8_t base_rep;
  char fill_char_str;
  ostream *poVar3;
  value_type local_219;
  unsigned_fast_type local_218;
  uintwide_t<256u,unsigned_short,void,false> *local_210;
  array<char,_94UL> local_208;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ostr;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
  uVar1 = *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  base_rep = '\x10';
  if ((uVar1 & 8) == 0) {
    base_rep = '\n';
  }
  uVar2 = *(unsigned_fast_type *)(out + *(long *)(*(long *)out + -0x18) + 0x10);
  fill_char_str = std::ios::fill();
  if ((uVar1 & 0x40) == 0) {
    if ((uVar1 & 0x48) == 8) {
      local_208.elems[0x30] = '\0';
      local_208.elems[0x31] = '\0';
      local_208.elems[0x32] = '\0';
      local_208.elems[0x33] = '\0';
      local_208.elems[0x34] = '\0';
      local_208.elems[0x35] = '\0';
      local_208.elems[0x36] = '\0';
      local_208.elems[0x37] = '\0';
      local_208.elems[0x38] = '\0';
      local_208.elems[0x39] = '\0';
      local_208.elems[0x3a] = '\0';
      local_208.elems[0x3b] = '\0';
      local_208.elems[0x3c] = '\0';
      local_208.elems[0x3d] = '\0';
      local_208.elems[0x3e] = '\0';
      local_208.elems[0x3f] = '\0';
      local_208.elems[0x20] = '\0';
      local_208.elems[0x21] = '\0';
      local_208.elems[0x22] = '\0';
      local_208.elems[0x23] = '\0';
      local_208.elems[0x24] = '\0';
      local_208.elems[0x25] = '\0';
      local_208.elems[0x26] = '\0';
      local_208.elems[0x27] = '\0';
      local_208.elems[0x28] = '\0';
      local_208.elems[0x29] = '\0';
      local_208.elems[0x2a] = '\0';
      local_208.elems[0x2b] = '\0';
      local_208.elems[0x2c] = '\0';
      local_208.elems[0x2d] = '\0';
      local_208.elems[0x2e] = '\0';
      local_208.elems[0x2f] = '\0';
      local_208.elems[0x40] = '\0';
      local_208.elems[0x41] = '\0';
      local_208.elems[0x42] = '\0';
      local_208.elems[0x43] = '\0';
      local_208.elems[0x44] = '\0';
      local_208.elems[0x45] = '\0';
      local_208.elems[0x46] = '\0';
      local_208.elems[0x47] = '\0';
      local_208.elems[0x10] = '\0';
      local_208.elems[0x11] = '\0';
      local_208.elems[0x12] = '\0';
      local_208.elems[0x13] = '\0';
      local_208.elems[0x14] = '\0';
      local_208.elems[0x15] = '\0';
      local_208.elems[0x16] = '\0';
      local_208.elems[0x17] = '\0';
      local_208.elems[0x18] = '\0';
      local_208.elems[0x19] = '\0';
      local_208.elems[0x1a] = '\0';
      local_208.elems[0x1b] = '\0';
      local_208.elems[0x1c] = '\0';
      local_208.elems[0x1d] = '\0';
      local_208.elems[0x1e] = '\0';
      local_208.elems[0x1f] = '\0';
      local_208.elems[0] = '\0';
      local_208.elems[1] = '\0';
      local_208.elems[2] = '\0';
      local_208.elems[3] = '\0';
      local_208.elems[4] = '\0';
      local_208.elems[5] = '\0';
      local_208.elems[6] = '\0';
      local_208.elems[7] = '\0';
      local_208.elems[8] = '\0';
      local_208.elems[9] = '\0';
      local_208.elems[10] = '\0';
      local_208.elems[0xb] = '\0';
      local_208.elems[0xc] = '\0';
      local_208.elems[0xd] = '\0';
      local_208.elems[0xe] = '\0';
      local_208.elems[0xf] = '\0';
      local_219 = '\0';
      local_218 = uVar2;
      local_210 = (uintwide_t<256u,unsigned_short,void,false> *)x;
      detail::array_detail::array<char,_72UL>::assign((array<char,_72UL> *)&local_208,&local_219);
      uintwide_t<256u,unsigned_short,void,false>::wr_string<char*>
                (local_210,local_208.elems,base_rep,(bool)((byte)(uVar1 >> 9) & 1),
                 (bool)((byte)(uVar1 >> 0xb) & 1),(bool)((byte)(uVar1 >> 0xe) & 1),local_218,
                 fill_char_str);
      std::operator<<((ostream *)&ostr,local_208.elems);
    }
    else if ((uVar1 & 0x48) == 0) {
      local_208.elems[0x40] = '\0';
      local_208.elems[0x41] = '\0';
      local_208.elems[0x42] = '\0';
      local_208.elems[0x43] = '\0';
      local_208.elems[0x44] = '\0';
      local_208.elems[0x45] = '\0';
      local_208.elems[0x46] = '\0';
      local_208.elems[0x47] = '\0';
      local_208.elems[0x48] = '\0';
      local_208.elems[0x49] = '\0';
      local_208.elems[0x4a] = '\0';
      local_208.elems[0x4b] = '\0';
      local_208.elems[0x4c] = '\0';
      local_208.elems[0x4d] = '\0';
      local_208.elems[0x4e] = '\0';
      local_208.elems[0x30] = '\0';
      local_208.elems[0x31] = '\0';
      local_208.elems[0x32] = '\0';
      local_208.elems[0x33] = '\0';
      local_208.elems[0x34] = '\0';
      local_208.elems[0x35] = '\0';
      local_208.elems[0x36] = '\0';
      local_208.elems[0x37] = '\0';
      local_208.elems[0x38] = '\0';
      local_208.elems[0x39] = '\0';
      local_208.elems[0x3a] = '\0';
      local_208.elems[0x3b] = '\0';
      local_208.elems[0x3c] = '\0';
      local_208.elems[0x3d] = '\0';
      local_208.elems[0x3e] = '\0';
      local_208.elems[0x3f] = '\0';
      local_208.elems[0x20] = '\0';
      local_208.elems[0x21] = '\0';
      local_208.elems[0x22] = '\0';
      local_208.elems[0x23] = '\0';
      local_208.elems[0x24] = '\0';
      local_208.elems[0x25] = '\0';
      local_208.elems[0x26] = '\0';
      local_208.elems[0x27] = '\0';
      local_208.elems[0x28] = '\0';
      local_208.elems[0x29] = '\0';
      local_208.elems[0x2a] = '\0';
      local_208.elems[0x2b] = '\0';
      local_208.elems[0x2c] = '\0';
      local_208.elems[0x2d] = '\0';
      local_208.elems[0x2e] = '\0';
      local_208.elems[0x2f] = '\0';
      local_208.elems[0x4f] = '\0';
      local_208.elems[0x50] = '\0';
      local_208.elems[0x51] = '\0';
      local_208.elems[0x52] = '\0';
      local_208.elems[0x53] = '\0';
      local_208.elems[0x54] = '\0';
      local_208.elems[0x55] = '\0';
      local_208.elems[0x56] = '\0';
      local_208.elems[0x10] = '\0';
      local_208.elems[0x11] = '\0';
      local_208.elems[0x12] = '\0';
      local_208.elems[0x13] = '\0';
      local_208.elems[0x14] = '\0';
      local_208.elems[0x15] = '\0';
      local_208.elems[0x16] = '\0';
      local_208.elems[0x17] = '\0';
      local_208.elems[0x18] = '\0';
      local_208.elems[0x19] = '\0';
      local_208.elems[0x1a] = '\0';
      local_208.elems[0x1b] = '\0';
      local_208.elems[0x1c] = '\0';
      local_208.elems[0x1d] = '\0';
      local_208.elems[0x1e] = '\0';
      local_208.elems[0x1f] = '\0';
      local_208.elems[0] = '\0';
      local_208.elems[1] = '\0';
      local_208.elems[2] = '\0';
      local_208.elems[3] = '\0';
      local_208.elems[4] = '\0';
      local_208.elems[5] = '\0';
      local_208.elems[6] = '\0';
      local_208.elems[7] = '\0';
      local_208.elems[8] = '\0';
      local_208.elems[9] = '\0';
      local_208.elems[10] = '\0';
      local_208.elems[0xb] = '\0';
      local_208.elems[0xc] = '\0';
      local_208.elems[0xd] = '\0';
      local_208.elems[0xe] = '\0';
      local_208.elems[0xf] = '\0';
      local_219 = '\0';
      local_218 = uVar2;
      local_210 = (uintwide_t<256u,unsigned_short,void,false> *)x;
      detail::array_detail::array<char,_87UL>::assign((array<char,_87UL> *)&local_208,&local_219);
      uintwide_t<256u,unsigned_short,void,false>::wr_string<char*>
                (local_210,local_208.elems,base_rep,(bool)((byte)(uVar1 >> 9) & 1),
                 (bool)((byte)(uVar1 >> 0xb) & 1),(bool)((byte)(uVar1 >> 0xe) & 1),local_218,
                 fill_char_str);
      std::operator<<((ostream *)&ostr,local_208.elems);
    }
  }
  else {
    local_208.elems[0x50] = '\0';
    local_208.elems[0x51] = '\0';
    local_208.elems[0x52] = '\0';
    local_208.elems[0x53] = '\0';
    local_208.elems[0x54] = '\0';
    local_208.elems[0x55] = '\0';
    local_208.elems[0x56] = '\0';
    local_208.elems[0x57] = '\0';
    local_208.elems[0x58] = '\0';
    local_208.elems[0x59] = '\0';
    local_208.elems[0x5a] = '\0';
    local_208.elems[0x5b] = '\0';
    local_208.elems[0x5c] = '\0';
    local_208.elems[0x5d] = '\0';
    local_208.elems[0x40] = '\0';
    local_208.elems[0x41] = '\0';
    local_208.elems[0x42] = '\0';
    local_208.elems[0x43] = '\0';
    local_208.elems[0x44] = '\0';
    local_208.elems[0x45] = '\0';
    local_208.elems[0x46] = '\0';
    local_208.elems[0x47] = '\0';
    local_208.elems[0x48] = '\0';
    local_208.elems[0x49] = '\0';
    local_208.elems[0x4a] = '\0';
    local_208.elems[0x4b] = '\0';
    local_208.elems[0x4c] = '\0';
    local_208.elems[0x4d] = '\0';
    local_208.elems[0x4e] = '\0';
    local_208.elems[0x4f] = '\0';
    local_208.elems[0x30] = '\0';
    local_208.elems[0x31] = '\0';
    local_208.elems[0x32] = '\0';
    local_208.elems[0x33] = '\0';
    local_208.elems[0x34] = '\0';
    local_208.elems[0x35] = '\0';
    local_208.elems[0x36] = '\0';
    local_208.elems[0x37] = '\0';
    local_208.elems[0x38] = '\0';
    local_208.elems[0x39] = '\0';
    local_208.elems[0x3a] = '\0';
    local_208.elems[0x3b] = '\0';
    local_208.elems[0x3c] = '\0';
    local_208.elems[0x3d] = '\0';
    local_208.elems[0x3e] = '\0';
    local_208.elems[0x3f] = '\0';
    local_208.elems[0x20] = '\0';
    local_208.elems[0x21] = '\0';
    local_208.elems[0x22] = '\0';
    local_208.elems[0x23] = '\0';
    local_208.elems[0x24] = '\0';
    local_208.elems[0x25] = '\0';
    local_208.elems[0x26] = '\0';
    local_208.elems[0x27] = '\0';
    local_208.elems[0x28] = '\0';
    local_208.elems[0x29] = '\0';
    local_208.elems[0x2a] = '\0';
    local_208.elems[0x2b] = '\0';
    local_208.elems[0x2c] = '\0';
    local_208.elems[0x2d] = '\0';
    local_208.elems[0x2e] = '\0';
    local_208.elems[0x2f] = '\0';
    local_208.elems[0x10] = '\0';
    local_208.elems[0x11] = '\0';
    local_208.elems[0x12] = '\0';
    local_208.elems[0x13] = '\0';
    local_208.elems[0x14] = '\0';
    local_208.elems[0x15] = '\0';
    local_208.elems[0x16] = '\0';
    local_208.elems[0x17] = '\0';
    local_208.elems[0x18] = '\0';
    local_208.elems[0x19] = '\0';
    local_208.elems[0x1a] = '\0';
    local_208.elems[0x1b] = '\0';
    local_208.elems[0x1c] = '\0';
    local_208.elems[0x1d] = '\0';
    local_208.elems[0x1e] = '\0';
    local_208.elems[0x1f] = '\0';
    local_208.elems[0] = '\0';
    local_208.elems[1] = '\0';
    local_208.elems[2] = '\0';
    local_208.elems[3] = '\0';
    local_208.elems[4] = '\0';
    local_208.elems[5] = '\0';
    local_208.elems[6] = '\0';
    local_208.elems[7] = '\0';
    local_208.elems[8] = '\0';
    local_208.elems[9] = '\0';
    local_208.elems[10] = '\0';
    local_208.elems[0xb] = '\0';
    local_208.elems[0xc] = '\0';
    local_208.elems[0xd] = '\0';
    local_208.elems[0xe] = '\0';
    local_208.elems[0xf] = '\0';
    local_219 = '\0';
    local_218 = uVar2;
    local_210 = (uintwide_t<256u,unsigned_short,void,false> *)x;
    detail::array_detail::array<char,_94UL>::assign(&local_208,&local_219);
    uintwide_t<256u,unsigned_short,void,false>::wr_string<char*>
              (local_210,local_208.elems,'\b',(bool)((byte)(uVar1 >> 9) & 1),
               (bool)((byte)(uVar1 >> 0xb) & 1),(bool)((byte)(uVar1 >> 0xe) & 1),local_218,
               fill_char_str);
    std::operator<<((ostream *)&ostr,local_208.elems);
  }
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<(out,(string *)&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
  return poVar3;
}

Assistant:

auto operator<<(std::basic_ostream<char_type, traits_type>& out,
                  const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> std::basic_ostream<char_type, traits_type>&
  {
    std::basic_ostringstream<char_type, traits_type> ostr;

    const std::ios::fmtflags my_flags = out.flags();

    const auto show_pos     = ((my_flags & std::ios::showpos)   == std::ios::showpos);
    const auto show_base    = ((my_flags & std::ios::showbase)  == std::ios::showbase);
    const auto is_uppercase = ((my_flags & std::ios::uppercase) == std::ios::uppercase);

    auto base_rep = std::uint_fast8_t { };

    if     ((my_flags & std::ios::oct) == std::ios::oct) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C( 8)); }
    else if((my_flags & std::ios::hex) == std::ios::hex) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(16)); }
    else                                                 { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(10)); }

    const auto field_width   = static_cast<unsigned_fast_type>(out.width());
    const auto fill_char_out = static_cast<char>(out.fill());

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;

    if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
    {
      using string_storage_oct_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_oct_type str_result { }; // LCOV_EXCL_LINE

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
    {
      using string_storage_dec_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                          std::allocator<void>,
                                                                                          AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_dec_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
    {
      using string_storage_hex_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_hex_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }

    return (out << ostr.str());
  }